

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aac.cpp
# Opt level: O2

void __thiscall AACCodec::buildADTSHeader(AACCodec *this,uint8_t *buffer,uint frameSize)

{
  uint8_t i_1;
  uint8_t i;
  long lVar1;
  uint uVar2;
  int *piVar3;
  BitStreamWriter writer;
  
  writer.super_BitStream.m_totalBits = 0;
  writer.super_BitStream.m_buffer = (uint *)0x0;
  writer.super_BitStream.m_initBuffer = (uint *)0x0;
  writer.m_curVal = 0;
  writer.m_bitWrited = 0;
  BitStreamWriter::setBuffer(&writer,buffer,buffer + 7);
  BitStreamWriter::putBits(&writer,0xc,0xfff);
  BitStreamWriter::putBit(&writer,this->m_id);
  BitStreamWriter::putBits(&writer,2,this->m_layer);
  BitStreamWriter::putBit(&writer,1);
  BitStreamWriter::putBits(&writer,2,(uint)this->m_profile);
  this->m_sample_rates_index = '\0';
  piVar3 = aac_sample_rates;
  uVar2 = 0;
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    if (*piVar3 == this->m_sample_rate) {
      this->m_sample_rates_index = (uint8_t)lVar1;
      uVar2 = (uint)lVar1;
      break;
    }
    piVar3 = piVar3 + 1;
  }
  BitStreamWriter::putBits(&writer,4,uVar2);
  uVar2 = 0;
  BitStreamWriter::putBit(&writer,0);
  this->m_channels_index = '\0';
  lVar1 = 0;
  do {
    if (lVar1 == 8) {
LAB_0018b606:
      BitStreamWriter::putBits(&writer,3,uVar2);
      BitStreamWriter::putBit(&writer,0);
      BitStreamWriter::putBit(&writer,0);
      BitStreamWriter::putBit(&writer,0);
      BitStreamWriter::putBit(&writer,0);
      BitStreamWriter::putBits(&writer,0xd,frameSize);
      BitStreamWriter::putBits(&writer,0xb,0x7ff);
      BitStreamWriter::putBits(&writer,2,(uint)this->m_rdb);
      BitStreamWriter::flushBits(&writer);
      return;
    }
    if (""[lVar1] == this->m_channels) {
      this->m_channels_index = (uint8_t)lVar1;
      uVar2 = (uint)lVar1;
      goto LAB_0018b606;
    }
    lVar1 = lVar1 + 1;
  } while( true );
}

Assistant:

void AACCodec::buildADTSHeader(uint8_t* buffer, const unsigned frameSize)
{
    BitStreamWriter writer{};
    writer.setBuffer(buffer, buffer + AAC_HEADER_LEN);
    writer.putBits(12, 0xfff);
    writer.putBit(m_id);
    writer.putBits(2, m_layer);
    writer.putBit(1);  // protection_absent
    writer.putBits(2, m_profile);
    m_sample_rates_index = 0;
    for (uint8_t i = 0; i < 16; i++)
        if (aac_sample_rates[i] == m_sample_rate)
        {
            m_sample_rates_index = i;
            break;
        }
    writer.putBits(4, m_sample_rates_index);
    writer.putBit(0); /* private_bit */
    m_channels_index = 0;
    for (uint8_t i = 0; i < 8; i++)
        if (aac_channels[i] == m_channels)
        {
            m_channels_index = i;
            break;
        }
    writer.putBits(3, m_channels_index);

    writer.putBit(0); /* original/copy */
    writer.putBit(0); /* home */

    /* adts_variable_header */
    writer.putBit(0); /* copyright_identification_bit */
    writer.putBit(0); /* copyright_identification_start */

    writer.putBits(13, frameSize);  // /* aac_frame_length */
    writer.putBits(11, 2047);       // /* adts_buffer_fullness */
    writer.putBits(2, m_rdb);       /* number_of_raw_data_blocks_in_frame */
    writer.flushBits();
}